

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O0

void __thiscall
mp::
BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AtanId>_>
::Run(BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AtanId>_>
      *this)

{
  uint uVar1;
  PLPoints *pPVar2;
  BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AtanId>_>
  *in_RDI;
  
  (*in_RDI->_vptr_BasicPLApproximator[0xf])();
  pPVar2 = GetPL(in_RDI);
  uVar1 = (*in_RDI->_vptr_BasicPLApproximator[0x10])(in_RDI,pPVar2);
  if ((uVar1 & 1) != 0) {
    uVar1 = (*in_RDI->_vptr_BasicPLApproximator[0x11])();
    if ((uVar1 & 1) == 0) {
      (*in_RDI->_vptr_BasicPLApproximator[0x12])();
    }
    (*in_RDI->_vptr_BasicPLApproximator[0x13])();
    do {
      (*in_RDI->_vptr_BasicPLApproximator[0x15])();
      uVar1 = (*in_RDI->_vptr_BasicPLApproximator[0x14])();
    } while ((uVar1 & 1) != 0);
    (*in_RDI->_vptr_BasicPLApproximator[0x16])();
    (*in_RDI->_vptr_BasicPLApproximator[0x17])();
  }
  return;
}

Assistant:

void BasicPLApproximator<FuncCon>::Run() {
   ClipFuncGraphDomain();
   if (CheckDomainReturnFalseIfTrivial(GetPL())) {
     if (!InitPeriodic())
       InitNonPeriodic();
     InitSubintervalLoop();
     do {
       ApproximateSubinterval();
     } while (NextSubinterval());
     ClipGraphFinal();
     ConsiderIntegrality();
   }
 }